

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

void hashblock(decaf_sha512_ctx_s *ctx)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  uint64_t uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  long lVar56;
  ulong uVar57;
  
  uVar1 = ctx->state[0];
  uVar2 = ctx->state[1];
  uVar3 = ctx->state[2];
  uVar4 = ctx->state[3];
  uVar5 = ctx->state[4];
  uVar6 = ctx->state[5];
  uVar7 = ctx->state[6];
  uVar8 = ctx->state[7];
  uVar9 = load_bigendian(ctx->block);
  uVar10 = load_bigendian(ctx->block + 8);
  uVar11 = load_bigendian(ctx->block + 0x10);
  uVar12 = load_bigendian(ctx->block + 0x18);
  uVar13 = load_bigendian(ctx->block + 0x20);
  uVar14 = load_bigendian(ctx->block + 0x28);
  uVar15 = load_bigendian(ctx->block + 0x30);
  uVar16 = load_bigendian(ctx->block + 0x38);
  uVar17 = load_bigendian(ctx->block + 0x40);
  uVar18 = load_bigendian(ctx->block + 0x48);
  uVar19 = load_bigendian(ctx->block + 0x50);
  uVar20 = load_bigendian(ctx->block + 0x58);
  uVar21 = load_bigendian(ctx->block + 0x60);
  uVar22 = load_bigendian(ctx->block + 0x68);
  uVar23 = load_bigendian(ctx->block + 0x70);
  uVar24 = load_bigendian(ctx->block + 0x78);
  lVar26 = uVar9 + 0x428a2f98d728ae22 +
           ((uVar6 ^ uVar7) & uVar5 ^ uVar7) + uVar8 +
           ((uVar5 << 0x17 | uVar5 >> 0x29) ^
           (uVar5 << 0x2e | uVar5 >> 0x12) ^ (uVar5 << 0x32 | uVar5 >> 0xe));
  uVar32 = (uVar3 & uVar2 ^ (uVar3 ^ uVar2) & uVar1) +
           ((uVar1 << 0x19 | uVar1 >> 0x27) ^
           (uVar1 << 0x1e | uVar1 >> 0x22) ^ (uVar1 << 0x24 | uVar1 >> 0x1c)) + lVar26;
  uVar27 = lVar26 + uVar4;
  lVar26 = ((uVar5 ^ uVar6) & uVar27 ^ uVar6) + uVar7 + uVar10 + 0x7137449123ef65cd +
           ((uVar27 * 0x800000 | uVar27 >> 0x29) ^
           (uVar27 << 0x2e | uVar27 >> 0x12) ^ (uVar27 << 0x32 | uVar27 >> 0xe));
  uVar33 = ((uVar2 ^ uVar1) & uVar32 ^ uVar2 & uVar1) +
           ((uVar32 * 0x2000000 | uVar32 >> 0x27) ^
           (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ (uVar32 << 0x24 | uVar32 >> 0x1c)) + lVar26;
  uVar29 = lVar26 + uVar3;
  lVar26 = ((uVar27 ^ uVar5) & uVar29 ^ uVar5) + uVar6 + uVar11 + -0x4a3f043013b2c4d1 +
           ((uVar29 * 0x800000 | uVar29 >> 0x29) ^
           (uVar29 << 0x2e | uVar29 >> 0x12) ^ (uVar29 << 0x32 | uVar29 >> 0xe));
  uVar35 = ((uVar32 ^ uVar1) & uVar33 ^ uVar32 & uVar1) +
           ((uVar33 * 0x2000000 | uVar33 >> 0x27) ^
           (uVar33 * 0x40000000 | uVar33 >> 0x22) ^ (uVar33 << 0x24 | uVar33 >> 0x1c)) + lVar26;
  uVar43 = lVar26 + uVar2;
  lVar26 = ((uVar29 ^ uVar27) & uVar43 ^ uVar27) + uVar5 + uVar12 + -0x164a245a7e762444 +
           ((uVar43 * 0x800000 | uVar43 >> 0x29) ^
           (uVar43 << 0x2e | uVar43 >> 0x12) ^ (uVar43 << 0x32 | uVar43 >> 0xe));
  uVar25 = ((uVar33 ^ uVar32) & uVar35 ^ uVar33 & uVar32) +
           ((uVar35 * 0x2000000 | uVar35 >> 0x27) ^
           (uVar35 * 0x40000000 | uVar35 >> 0x22) ^ (uVar35 << 0x24 | uVar35 >> 0x1c)) + lVar26;
  uVar40 = lVar26 + uVar1;
  lVar26 = uVar27 + uVar13 + ((uVar43 ^ uVar29) & uVar40 ^ uVar29) + 0x3956c25bf348b538 +
           ((uVar40 * 0x800000 | uVar40 >> 0x29) ^
           (uVar40 << 0x2e | uVar40 >> 0x12) ^ (uVar40 << 0x32 | uVar40 >> 0xe));
  uVar32 = uVar32 + lVar26;
  uVar27 = ((uVar35 ^ uVar33) & uVar25 ^ uVar35 & uVar33) +
           ((uVar25 * 0x2000000 | uVar25 >> 0x27) ^
           (uVar25 * 0x40000000 | uVar25 >> 0x22) ^ (uVar25 << 0x24 | uVar25 >> 0x1c)) + lVar26;
  lVar26 = uVar29 + uVar14 + ((uVar40 ^ uVar43) & uVar32 ^ uVar43) + 0x59f111f1b605d019 +
           ((uVar32 * 0x800000 | uVar32 >> 0x29) ^
           (uVar32 << 0x2e | uVar32 >> 0x12) ^ (uVar32 << 0x32 | uVar32 >> 0xe));
  uVar33 = uVar33 + lVar26;
  uVar29 = ((uVar25 ^ uVar35) & uVar27 ^ uVar25 & uVar35) +
           ((uVar27 * 0x2000000 | uVar27 >> 0x27) ^
           (uVar27 * 0x40000000 | uVar27 >> 0x22) ^ (uVar27 << 0x24 | uVar27 >> 0x1c)) + lVar26;
  lVar26 = uVar43 + uVar15 + ((uVar32 ^ uVar40) & uVar33 ^ uVar40) + -0x6dc07d5b50e6b065 +
           ((uVar33 * 0x800000 | uVar33 >> 0x29) ^
           (uVar33 << 0x2e | uVar33 >> 0x12) ^ (uVar33 << 0x32 | uVar33 >> 0xe));
  uVar35 = uVar35 + lVar26;
  uVar54 = ((uVar27 ^ uVar25) & uVar29 ^ uVar27 & uVar25) +
           ((uVar29 * 0x2000000 | uVar29 >> 0x27) ^
           (uVar29 * 0x40000000 | uVar29 >> 0x22) ^ (uVar29 << 0x24 | uVar29 >> 0x1c)) + lVar26;
  lVar26 = uVar40 + uVar16 + ((uVar33 ^ uVar32) & uVar35 ^ uVar32) + -0x54e3a12a25927ee8 +
           ((uVar35 * 0x800000 | uVar35 >> 0x29) ^
           (uVar35 << 0x2e | uVar35 >> 0x12) ^ (uVar35 << 0x32 | uVar35 >> 0xe));
  uVar25 = uVar25 + lVar26;
  uVar43 = ((uVar29 ^ uVar27) & uVar54 ^ uVar29 & uVar27) +
           ((uVar54 * 0x2000000 | uVar54 >> 0x27) ^
           (uVar54 * 0x40000000 | uVar54 >> 0x22) ^ (uVar54 << 0x24 | uVar54 >> 0x1c)) + lVar26;
  lVar26 = uVar32 + uVar17 + ((uVar35 ^ uVar33) & uVar25 ^ uVar33) + -0x27f855675cfcfdbe +
           ((uVar25 * 0x800000 | uVar25 >> 0x29) ^
           (uVar25 << 0x2e | uVar25 >> 0x12) ^ (uVar25 << 0x32 | uVar25 >> 0xe));
  uVar27 = uVar27 + lVar26;
  uVar40 = ((uVar54 ^ uVar29) & uVar43 ^ uVar54 & uVar29) +
           ((uVar43 * 0x2000000 | uVar43 >> 0x27) ^
           (uVar43 * 0x40000000 | uVar43 >> 0x22) ^ (uVar43 << 0x24 | uVar43 >> 0x1c)) + lVar26;
  lVar26 = uVar33 + uVar18 + ((uVar25 ^ uVar35) & uVar27 ^ uVar35) + 0x12835b0145706fbe +
           ((uVar27 * 0x800000 | uVar27 >> 0x29) ^
           (uVar27 << 0x2e | uVar27 >> 0x12) ^ (uVar27 << 0x32 | uVar27 >> 0xe));
  uVar29 = uVar29 + lVar26;
  uVar34 = ((uVar43 ^ uVar54) & uVar40 ^ uVar43 & uVar54) +
           ((uVar40 * 0x2000000 | uVar40 >> 0x27) ^
           (uVar40 * 0x40000000 | uVar40 >> 0x22) ^ (uVar40 << 0x24 | uVar40 >> 0x1c)) + lVar26;
  lVar26 = uVar35 + uVar19 + ((uVar27 ^ uVar25) & uVar29 ^ uVar25) + 0x243185be4ee4b28c +
           ((uVar29 * 0x800000 | uVar29 >> 0x29) ^
           (uVar29 << 0x2e | uVar29 >> 0x12) ^ (uVar29 << 0x32 | uVar29 >> 0xe));
  uVar54 = uVar54 + lVar26;
  uVar36 = ((uVar40 ^ uVar43) & uVar34 ^ uVar40 & uVar43) +
           ((uVar34 * 0x2000000 | uVar34 >> 0x27) ^
           (uVar34 * 0x40000000 | uVar34 >> 0x22) ^ (uVar34 << 0x24 | uVar34 >> 0x1c)) + lVar26;
  lVar26 = uVar25 + uVar20 + ((uVar29 ^ uVar27) & uVar54 ^ uVar27) + 0x550c7dc3d5ffb4e2 +
           ((uVar54 * 0x800000 | uVar54 >> 0x29) ^
           (uVar54 << 0x2e | uVar54 >> 0x12) ^ (uVar54 << 0x32 | uVar54 >> 0xe));
  uVar43 = uVar43 + lVar26;
  uVar41 = ((uVar34 ^ uVar40) & uVar36 ^ uVar34 & uVar40) +
           ((uVar36 * 0x2000000 | uVar36 >> 0x27) ^
           (uVar36 * 0x40000000 | uVar36 >> 0x22) ^ (uVar36 << 0x24 | uVar36 >> 0x1c)) + lVar26;
  lVar26 = uVar27 + uVar21 + ((uVar54 ^ uVar29) & uVar43 ^ uVar29) + 0x72be5d74f27b896f +
           ((uVar43 * 0x800000 | uVar43 >> 0x29) ^
           (uVar43 << 0x2e | uVar43 >> 0x12) ^ (uVar43 << 0x32 | uVar43 >> 0xe));
  uVar40 = uVar40 + lVar26;
  uVar44 = ((uVar36 ^ uVar34) & uVar41 ^ uVar36 & uVar34) +
           ((uVar41 * 0x2000000 | uVar41 >> 0x27) ^
           (uVar41 * 0x40000000 | uVar41 >> 0x22) ^ (uVar41 << 0x24 | uVar41 >> 0x1c)) + lVar26;
  lVar26 = uVar29 + uVar22 + ((uVar43 ^ uVar54) & uVar40 ^ uVar54) + -0x7f214e01c4e9694f +
           ((uVar40 * 0x800000 | uVar40 >> 0x29) ^
           (uVar40 << 0x2e | uVar40 >> 0x12) ^ (uVar40 << 0x32 | uVar40 >> 0xe));
  uVar34 = uVar34 + lVar26;
  uVar35 = ((uVar41 ^ uVar36) & uVar44 ^ uVar41 & uVar36) +
           ((uVar44 * 0x2000000 | uVar44 >> 0x27) ^
           (uVar44 * 0x40000000 | uVar44 >> 0x22) ^ (uVar44 << 0x24 | uVar44 >> 0x1c)) + lVar26;
  lVar26 = uVar54 + uVar23 + ((uVar40 ^ uVar43) & uVar34 ^ uVar43) + -0x6423f958da38edcb +
           ((uVar34 * 0x800000 | uVar34 >> 0x29) ^
           (uVar34 << 0x2e | uVar34 >> 0x12) ^ (uVar34 << 0x32 | uVar34 >> 0xe));
  uVar36 = uVar36 + lVar26;
  uVar55 = ((uVar44 ^ uVar41) & uVar35 ^ uVar44 & uVar41) +
           ((uVar35 * 0x2000000 | uVar35 >> 0x27) ^
           (uVar35 * 0x40000000 | uVar35 >> 0x22) ^ (uVar35 << 0x24 | uVar35 >> 0x1c)) + lVar26;
  lVar26 = uVar43 + uVar24 + ((uVar34 ^ uVar40) & uVar36 ^ uVar40) + -0x3e640e8b3096d96c +
           ((uVar36 * 0x800000 | uVar36 >> 0x29) ^
           (uVar36 << 0x2e | uVar36 >> 0x12) ^ (uVar36 << 0x32 | uVar36 >> 0xe));
  uVar41 = uVar41 + lVar26;
  uVar32 = ((uVar35 ^ uVar44) & uVar55 ^ uVar35 & uVar44) +
           ((uVar55 * 0x2000000 | uVar55 >> 0x27) ^
           (uVar55 * 0x40000000 | uVar55 >> 0x22) ^ (uVar55 << 0x24 | uVar55 >> 0x1c)) + lVar26;
  uVar43 = uVar9 + uVar18 +
           (uVar10 >> 7 ^
           (uVar10 << 0x38 | uVar10 >> 8) ^ (uVar10 >> 1 | (ulong)((uVar10 & 1) != 0) << 0x3f)) +
           (uVar23 >> 6 ^ (uVar23 << 3 | uVar23 >> 0x3d) ^ (uVar23 << 0x2d | uVar23 >> 0x13));
  uVar33 = uVar10 + uVar19 +
           (uVar11 >> 7 ^
           (uVar11 << 0x38 | uVar11 >> 8) ^ (uVar11 >> 1 | (ulong)((uVar11 & 1) != 0) << 0x3f)) +
           (uVar24 >> 6 ^ (uVar24 << 3 | uVar24 >> 0x3d) ^ (uVar24 << 0x2d | uVar24 >> 0x13));
  uVar49 = uVar11 + uVar20 +
           (uVar12 >> 7 ^
           (uVar12 << 0x38 | uVar12 >> 8) ^ (uVar12 >> 1 | (ulong)((uVar12 & 1) != 0) << 0x3f)) +
           (uVar43 >> 6 ^ (uVar43 * 8 | uVar43 >> 0x3d) ^ (uVar43 << 0x2d | uVar43 >> 0x13));
  uVar28 = uVar12 + uVar21 +
           (uVar13 >> 7 ^
           (uVar13 << 0x38 | uVar13 >> 8) ^ (uVar13 >> 1 | (ulong)((uVar13 & 1) != 0) << 0x3f)) +
           (uVar33 >> 6 ^ (uVar33 * 8 | uVar33 >> 0x3d) ^ (uVar33 << 0x2d | uVar33 >> 0x13));
  uVar30 = uVar13 + uVar22 +
           (uVar14 >> 7 ^
           (uVar14 << 0x38 | uVar14 >> 8) ^ (uVar14 >> 1 | (ulong)((uVar14 & 1) != 0) << 0x3f)) +
           (uVar49 >> 6 ^ (uVar49 * 8 | uVar49 >> 0x3d) ^ (uVar49 << 0x2d | uVar49 >> 0x13));
  uVar46 = uVar14 + uVar23 +
           (uVar15 >> 7 ^
           (uVar15 << 0x38 | uVar15 >> 8) ^ (uVar15 >> 1 | (ulong)((uVar15 & 1) != 0) << 0x3f)) +
           (uVar28 >> 6 ^ (uVar28 * 8 | uVar28 >> 0x3d) ^ (uVar28 << 0x2d | uVar28 >> 0x13));
  uVar50 = uVar15 + uVar24 +
           (uVar16 >> 7 ^
           (uVar16 << 0x38 | uVar16 >> 8) ^ (uVar16 >> 1 | (ulong)((uVar16 & 1) != 0) << 0x3f)) +
           (uVar30 >> 6 ^ (uVar30 * 8 | uVar30 >> 0x3d) ^ (uVar30 << 0x2d | uVar30 >> 0x13));
  uVar25 = (uVar17 >> 7 ^
           (uVar17 << 0x38 | uVar17 >> 8) ^ (uVar17 >> 1 | (ulong)((uVar17 & 1) != 0) << 0x3f)) +
           uVar16 + uVar43 +
           (uVar46 >> 6 ^ (uVar46 * 8 | uVar46 >> 0x3d) ^ (uVar46 << 0x2d | uVar46 >> 0x13));
  uVar51 = (uVar18 >> 7 ^
           (uVar18 << 0x38 | uVar18 >> 8) ^ (uVar18 >> 1 | (ulong)((uVar18 & 1) != 0) << 0x3f)) +
           uVar17 + uVar33 +
           (uVar50 >> 6 ^ (uVar50 * 8 | uVar50 >> 0x3d) ^ (uVar50 << 0x2d | uVar50 >> 0x13));
  uVar48 = (uVar19 >> 7 ^
           (uVar19 << 0x38 | uVar19 >> 8) ^ (uVar19 >> 1 | (ulong)((uVar19 & 1) != 0) << 0x3f)) +
           uVar18 + uVar49 +
           (uVar25 >> 6 ^ (uVar25 * 8 | uVar25 >> 0x3d) ^ (uVar25 << 0x2d | uVar25 >> 0x13));
  uVar27 = (uVar20 >> 7 ^
           (uVar20 << 0x38 | uVar20 >> 8) ^ (uVar20 >> 1 | (ulong)((uVar20 & 1) != 0) << 0x3f)) +
           uVar19 + uVar28 +
           (uVar51 >> 6 ^ (uVar51 * 8 | uVar51 >> 0x3d) ^ (uVar51 << 0x2d | uVar51 >> 0x13));
  uVar29 = (uVar21 >> 7 ^
           (uVar21 << 0x38 | uVar21 >> 8) ^ (uVar21 >> 1 | (ulong)((uVar21 & 1) != 0) << 0x3f)) +
           uVar20 + uVar30 +
           (uVar48 >> 6 ^ (uVar48 * 8 | uVar48 >> 0x3d) ^ (uVar48 << 0x2d | uVar48 >> 0x13));
  uVar52 = (uVar22 >> 7 ^
           (uVar22 << 0x38 | uVar22 >> 8) ^ (uVar22 >> 1 | (ulong)((uVar22 & 1) != 0) << 0x3f)) +
           uVar21 + uVar46 +
           (uVar27 >> 6 ^ (uVar27 * 8 | uVar27 >> 0x3d) ^ (uVar27 << 0x2d | uVar27 >> 0x13));
  uVar31 = (uVar23 >> 7 ^
           (uVar23 << 0x38 | uVar23 >> 8) ^ (uVar23 >> 1 | (ulong)((uVar23 & 1) != 0) << 0x3f)) +
           uVar22 + uVar50 +
           (uVar29 >> 6 ^ (uVar29 * 8 | uVar29 >> 0x3d) ^ (uVar29 << 0x2d | uVar29 >> 0x13));
  uVar54 = (uVar24 >> 7 ^
           (uVar24 << 0x38 | uVar24 >> 8) ^ (uVar24 >> 1 | (ulong)((uVar24 & 1) != 0) << 0x3f)) +
           uVar23 + uVar25 +
           (uVar52 >> 6 ^ (uVar52 * 8 | uVar52 >> 0x3d) ^ (uVar52 << 0x2d | uVar52 >> 0x13));
  uVar47 = (uVar43 >> 7 ^
           (uVar43 << 0x38 | uVar43 >> 8) ^ (uVar43 >> 1 | (ulong)((uVar43 & 1) != 0) << 0x3f)) +
           uVar24 + uVar51 +
           (uVar31 >> 6 ^ (uVar31 * 8 | uVar31 >> 0x3d) ^ (uVar31 << 0x2d | uVar31 >> 0x13));
  lVar26 = uVar40 + uVar43 + ((uVar36 ^ uVar34) & uVar41 ^ uVar34) + -0x1b64963e610eb52e +
           ((uVar41 * 0x800000 | uVar41 >> 0x29) ^
           (uVar41 << 0x2e | uVar41 >> 0x12) ^ (uVar41 << 0x32 | uVar41 >> 0xe));
  uVar44 = uVar44 + lVar26;
  uVar40 = ((uVar55 ^ uVar35) & uVar32 ^ uVar55 & uVar35) +
           ((uVar32 * 0x2000000 | uVar32 >> 0x27) ^
           (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ (uVar32 << 0x24 | uVar32 >> 0x1c)) + lVar26;
  lVar26 = uVar34 + uVar33 + ((uVar41 ^ uVar36) & uVar44 ^ uVar36) + -0x1041b879c7b0da1d +
           ((uVar44 * 0x800000 | uVar44 >> 0x29) ^
           (uVar44 << 0x2e | uVar44 >> 0x12) ^ (uVar44 << 0x32 | uVar44 >> 0xe));
  uVar35 = uVar35 + lVar26;
  uVar53 = ((uVar32 ^ uVar55) & uVar40 ^ uVar32 & uVar55) +
           ((uVar40 * 0x2000000 | uVar40 >> 0x27) ^
           (uVar40 * 0x40000000 | uVar40 >> 0x22) ^ (uVar40 << 0x24 | uVar40 >> 0x1c)) + lVar26;
  lVar26 = uVar36 + uVar49 + ((uVar44 ^ uVar41) & uVar35 ^ uVar41) + 0xfc19dc68b8cd5b5 +
           ((uVar35 * 0x800000 | uVar35 >> 0x29) ^
           (uVar35 << 0x2e | uVar35 >> 0x12) ^ (uVar35 << 0x32 | uVar35 >> 0xe));
  uVar55 = uVar55 + lVar26;
  uVar36 = ((uVar40 ^ uVar32) & uVar53 ^ uVar40 & uVar32) +
           ((uVar53 * 0x2000000 | uVar53 >> 0x27) ^
           (uVar53 * 0x40000000 | uVar53 >> 0x22) ^ (uVar53 << 0x24 | uVar53 >> 0x1c)) + lVar26;
  lVar26 = uVar41 + uVar28 + ((uVar35 ^ uVar44) & uVar55 ^ uVar44) + 0x240ca1cc77ac9c65 +
           ((uVar55 * 0x800000 | uVar55 >> 0x29) ^
           (uVar55 << 0x2e | uVar55 >> 0x12) ^ (uVar55 << 0x32 | uVar55 >> 0xe));
  uVar32 = uVar32 + lVar26;
  uVar34 = ((uVar53 ^ uVar40) & uVar36 ^ uVar53 & uVar40) +
           ((uVar36 * 0x2000000 | uVar36 >> 0x27) ^
           (uVar36 * 0x40000000 | uVar36 >> 0x22) ^ (uVar36 << 0x24 | uVar36 >> 0x1c)) + lVar26;
  lVar26 = uVar44 + uVar30 + ((uVar55 ^ uVar35) & uVar32 ^ uVar35) + 0x2de92c6f592b0275 +
           ((uVar32 * 0x800000 | uVar32 >> 0x29) ^
           (uVar32 << 0x2e | uVar32 >> 0x12) ^ (uVar32 << 0x32 | uVar32 >> 0xe));
  uVar40 = uVar40 + lVar26;
  uVar41 = ((uVar36 ^ uVar53) & uVar34 ^ uVar36 & uVar53) +
           ((uVar34 * 0x2000000 | uVar34 >> 0x27) ^
           (uVar34 * 0x40000000 | uVar34 >> 0x22) ^ (uVar34 << 0x24 | uVar34 >> 0x1c)) + lVar26;
  lVar26 = uVar35 + uVar46 + ((uVar32 ^ uVar55) & uVar40 ^ uVar55) + 0x4a7484aa6ea6e483 +
           ((uVar40 * 0x800000 | uVar40 >> 0x29) ^
           (uVar40 << 0x2e | uVar40 >> 0x12) ^ (uVar40 << 0x32 | uVar40 >> 0xe));
  uVar53 = uVar53 + lVar26;
  uVar37 = ((uVar34 ^ uVar36) & uVar41 ^ uVar34 & uVar36) +
           ((uVar41 * 0x2000000 | uVar41 >> 0x27) ^
           (uVar41 * 0x40000000 | uVar41 >> 0x22) ^ (uVar41 << 0x24 | uVar41 >> 0x1c)) + lVar26;
  lVar26 = uVar55 + uVar50 + ((uVar40 ^ uVar32) & uVar53 ^ uVar32) + 0x5cb0a9dcbd41fbd4 +
           ((uVar53 * 0x800000 | uVar53 >> 0x29) ^
           (uVar53 << 0x2e | uVar53 >> 0x12) ^ (uVar53 << 0x32 | uVar53 >> 0xe));
  uVar36 = uVar36 + lVar26;
  uVar55 = ((uVar41 ^ uVar34) & uVar37 ^ uVar41 & uVar34) +
           ((uVar37 * 0x2000000 | uVar37 >> 0x27) ^
           (uVar37 * 0x40000000 | uVar37 >> 0x22) ^ (uVar37 << 0x24 | uVar37 >> 0x1c)) + lVar26;
  lVar26 = uVar32 + uVar25 + ((uVar53 ^ uVar40) & uVar36 ^ uVar40) + 0x76f988da831153b5 +
           ((uVar36 * 0x800000 | uVar36 >> 0x29) ^
           (uVar36 << 0x2e | uVar36 >> 0x12) ^ (uVar36 << 0x32 | uVar36 >> 0xe));
  uVar34 = uVar34 + lVar26;
  uVar45 = ((uVar37 ^ uVar41) & uVar55 ^ uVar37 & uVar41) +
           ((uVar55 * 0x2000000 | uVar55 >> 0x27) ^
           (uVar55 * 0x40000000 | uVar55 >> 0x22) ^ (uVar55 << 0x24 | uVar55 >> 0x1c)) + lVar26;
  lVar26 = uVar40 + uVar51 + ((uVar36 ^ uVar53) & uVar34 ^ uVar53) + -0x67c1aead11992055 +
           ((uVar34 * 0x800000 | uVar34 >> 0x29) ^
           (uVar34 << 0x2e | uVar34 >> 0x12) ^ (uVar34 << 0x32 | uVar34 >> 0xe));
  uVar41 = uVar41 + lVar26;
  uVar35 = ((uVar55 ^ uVar37) & uVar45 ^ uVar55 & uVar37) +
           ((uVar45 * 0x2000000 | uVar45 >> 0x27) ^
           (uVar45 * 0x40000000 | uVar45 >> 0x22) ^ (uVar45 << 0x24 | uVar45 >> 0x1c)) + lVar26;
  lVar26 = uVar53 + uVar48 + ((uVar34 ^ uVar36) & uVar41 ^ uVar36) + -0x57ce3992d24bcdf0 +
           ((uVar41 * 0x800000 | uVar41 >> 0x29) ^
           (uVar41 << 0x2e | uVar41 >> 0x12) ^ (uVar41 << 0x32 | uVar41 >> 0xe));
  uVar37 = uVar37 + lVar26;
  uVar40 = ((uVar45 ^ uVar55) & uVar35 ^ uVar45 & uVar55) +
           ((uVar35 * 0x2000000 | uVar35 >> 0x27) ^
           (uVar35 * 0x40000000 | uVar35 >> 0x22) ^ (uVar35 << 0x24 | uVar35 >> 0x1c)) + lVar26;
  lVar26 = uVar36 + uVar27 + ((uVar41 ^ uVar34) & uVar37 ^ uVar34) + -0x4ffcd8376704dec1 +
           ((uVar37 * 0x800000 | uVar37 >> 0x29) ^
           (uVar37 << 0x2e | uVar37 >> 0x12) ^ (uVar37 << 0x32 | uVar37 >> 0xe));
  uVar55 = uVar55 + lVar26;
  uVar32 = ((uVar35 ^ uVar45) & uVar40 ^ uVar35 & uVar45) +
           ((uVar40 * 0x2000000 | uVar40 >> 0x27) ^
           (uVar40 * 0x40000000 | uVar40 >> 0x22) ^ (uVar40 << 0x24 | uVar40 >> 0x1c)) + lVar26;
  lVar26 = uVar34 + uVar29 + ((uVar37 ^ uVar41) & uVar55 ^ uVar41) + -0x40a680384110f11c +
           ((uVar55 * 0x800000 | uVar55 >> 0x29) ^
           (uVar55 << 0x2e | uVar55 >> 0x12) ^ (uVar55 << 0x32 | uVar55 >> 0xe));
  uVar45 = uVar45 + lVar26;
  uVar36 = ((uVar40 ^ uVar35) & uVar32 ^ uVar40 & uVar35) +
           ((uVar32 * 0x2000000 | uVar32 >> 0x27) ^
           (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ (uVar32 << 0x24 | uVar32 >> 0x1c)) + lVar26;
  lVar26 = uVar41 + uVar52 + ((uVar55 ^ uVar37) & uVar45 ^ uVar37) + -0x391ff40cc257703e +
           ((uVar45 * 0x800000 | uVar45 >> 0x29) ^
           (uVar45 << 0x2e | uVar45 >> 0x12) ^ (uVar45 << 0x32 | uVar45 >> 0xe));
  uVar35 = uVar35 + lVar26;
  uVar44 = ((uVar32 ^ uVar40) & uVar36 ^ uVar32 & uVar40) +
           ((uVar36 * 0x2000000 | uVar36 >> 0x27) ^
           (uVar36 * 0x40000000 | uVar36 >> 0x22) ^ (uVar36 << 0x24 | uVar36 >> 0x1c)) + lVar26;
  lVar26 = uVar37 + uVar31 + ((uVar45 ^ uVar55) & uVar35 ^ uVar55) + -0x2a586eb86cf558db +
           ((uVar35 * 0x800000 | uVar35 >> 0x29) ^
           (uVar35 << 0x2e | uVar35 >> 0x12) ^ (uVar35 << 0x32 | uVar35 >> 0xe));
  uVar40 = uVar40 + lVar26;
  uVar37 = ((uVar36 ^ uVar32) & uVar44 ^ uVar36 & uVar32) +
           ((uVar44 * 0x2000000 | uVar44 >> 0x27) ^
           (uVar44 * 0x40000000 | uVar44 >> 0x22) ^ (uVar44 << 0x24 | uVar44 >> 0x1c)) + lVar26;
  lVar26 = uVar55 + uVar54 + ((uVar35 ^ uVar45) & uVar40 ^ uVar45) + 0x6ca6351e003826f +
           ((uVar40 * 0x800000 | uVar40 >> 0x29) ^
           (uVar40 << 0x2e | uVar40 >> 0x12) ^ (uVar40 << 0x32 | uVar40 >> 0xe));
  uVar32 = uVar32 + lVar26;
  uVar55 = ((uVar44 ^ uVar36) & uVar37 ^ uVar44 & uVar36) +
           ((uVar37 * 0x2000000 | uVar37 >> 0x27) ^
           (uVar37 * 0x40000000 | uVar37 >> 0x22) ^ (uVar37 << 0x24 | uVar37 >> 0x1c)) + lVar26;
  lVar26 = uVar45 + uVar47 + ((uVar40 ^ uVar35) & uVar32 ^ uVar35) + 0x142929670a0e6e70 +
           ((uVar32 * 0x800000 | uVar32 >> 0x29) ^
           (uVar32 << 0x2e | uVar32 >> 0x12) ^ (uVar32 << 0x32 | uVar32 >> 0xe));
  uVar36 = uVar36 + lVar26;
  uVar45 = ((uVar37 ^ uVar44) & uVar55 ^ uVar37 & uVar44) +
           ((uVar55 * 0x2000000 | uVar55 >> 0x27) ^
           (uVar55 * 0x40000000 | uVar55 >> 0x22) ^ (uVar55 << 0x24 | uVar55 >> 0x1c)) + lVar26;
  uVar34 = (uVar33 >> 7 ^
           (uVar33 << 0x38 | uVar33 >> 8) ^ (uVar33 >> 1 | (ulong)((uVar33 & 1) != 0) << 0x3f)) +
           uVar43 + uVar48 +
           (uVar54 >> 6 ^ (uVar54 * 8 | uVar54 >> 0x3d) ^ (uVar54 << 0x2d | uVar54 >> 0x13));
  uVar53 = (uVar49 >> 7 ^
           (uVar49 << 0x38 | uVar49 >> 8) ^ (uVar49 >> 1 | (ulong)((uVar49 & 1) != 0) << 0x3f)) +
           uVar33 + uVar27 +
           (uVar47 >> 6 ^ (uVar47 * 8 | uVar47 >> 0x3d) ^ (uVar47 << 0x2d | uVar47 >> 0x13));
  uVar38 = (uVar28 >> 7 ^
           (uVar28 << 0x38 | uVar28 >> 8) ^ (uVar28 >> 1 | (ulong)((uVar28 & 1) != 0) << 0x3f)) +
           uVar49 + uVar29 +
           (uVar34 >> 6 ^ (uVar34 * 8 | uVar34 >> 0x3d) ^ (uVar34 << 0x2d | uVar34 >> 0x13));
  uVar49 = (uVar30 >> 7 ^
           (uVar30 << 0x38 | uVar30 >> 8) ^ (uVar30 >> 1 | (ulong)((uVar30 & 1) != 0) << 0x3f)) +
           uVar28 + uVar52 +
           (uVar53 >> 6 ^ (uVar53 * 8 | uVar53 >> 0x3d) ^ (uVar53 << 0x2d | uVar53 >> 0x13));
  lVar56 = uVar35 + uVar34 + ((uVar32 ^ uVar40) & uVar36 ^ uVar40) + 0x27b70a8546d22ffc +
           ((uVar36 * 0x800000 | uVar36 >> 0x29) ^
           (uVar36 << 0x2e | uVar36 >> 0x12) ^ (uVar36 << 0x32 | uVar36 >> 0xe));
  uVar44 = uVar44 + lVar56;
  uVar33 = (uVar46 >> 7 ^
           (uVar46 << 0x38 | uVar46 >> 8) ^ (uVar46 >> 1 | (ulong)((uVar46 & 1) != 0) << 0x3f)) +
           uVar30 + uVar31 +
           (uVar38 >> 6 ^ (uVar38 * 8 | uVar38 >> 0x3d) ^ (uVar38 << 0x2d | uVar38 >> 0x13));
  lVar39 = uVar40 + uVar53 + ((uVar36 ^ uVar32) & uVar44 ^ uVar32) + 0x2e1b21385c26c926 +
           ((uVar44 * 0x800000 | uVar44 >> 0x29) ^
           (uVar44 << 0x2e | uVar44 >> 0x12) ^ (uVar44 << 0x32 | uVar44 >> 0xe));
  uVar40 = uVar37 + lVar39;
  uVar30 = (uVar50 >> 7 ^
           (uVar50 << 0x38 | uVar50 >> 8) ^ (uVar50 >> 1 | (ulong)((uVar50 & 1) != 0) << 0x3f)) +
           uVar46 + uVar54 +
           (uVar49 >> 6 ^ (uVar49 * 8 | uVar49 >> 0x3d) ^ (uVar49 << 0x2d | uVar49 >> 0x13));
  lVar26 = uVar32 + uVar38 + ((uVar44 ^ uVar36) & uVar40 ^ uVar36) + 0x4d2c6dfc5ac42aed +
           ((uVar40 * 0x800000 | uVar40 >> 0x29) ^
           (uVar40 << 0x2e | uVar40 >> 0x12) ^ (uVar40 << 0x32 | uVar40 >> 0xe));
  uVar41 = uVar55 + lVar26;
  uVar35 = (uVar25 >> 7 ^
           (uVar25 << 0x38 | uVar25 >> 8) ^ (uVar25 >> 1 | (ulong)((uVar25 & 1) != 0) << 0x3f)) +
           uVar50 + uVar47 +
           (uVar33 >> 6 ^ (uVar33 * 8 | uVar33 >> 0x3d) ^ (uVar33 << 0x2d | uVar33 >> 0x13));
  uVar37 = ((uVar55 ^ uVar37) & uVar45 ^ uVar55 & uVar37) +
           ((uVar45 * 0x2000000 | uVar45 >> 0x27) ^
           (uVar45 * 0x40000000 | uVar45 >> 0x22) ^ (uVar45 << 0x24 | uVar45 >> 0x1c)) + lVar56;
  lVar42 = uVar36 + uVar49 + ((uVar40 ^ uVar44) & uVar41 ^ uVar44) + 0x53380d139d95b3df +
           ((uVar41 * 0x800000 | uVar41 >> 0x29) ^
           (uVar41 << 0x2e | uVar41 >> 0x12) ^ (uVar41 << 0x32 | uVar41 >> 0xe));
  uVar32 = uVar45 + lVar42;
  uVar43 = (uVar51 >> 7 ^
           (uVar51 << 0x38 | uVar51 >> 8) ^ (uVar51 >> 1 | (ulong)((uVar51 & 1) != 0) << 0x3f)) +
           uVar25 + uVar34 +
           (uVar30 >> 6 ^ (uVar30 * 8 | uVar30 >> 0x3d) ^ (uVar30 << 0x2d | uVar30 >> 0x13));
  uVar28 = ((uVar45 ^ uVar55) & uVar37 ^ uVar45 & uVar55) +
           ((uVar37 * 0x2000000 | uVar37 >> 0x27) ^
           (uVar37 * 0x40000000 | uVar37 >> 0x22) ^ (uVar37 << 0x24 | uVar37 >> 0x1c)) + lVar39;
  lVar39 = uVar44 + uVar33 + ((uVar41 ^ uVar40) & uVar32 ^ uVar40) + 0x650a73548baf63de +
           ((uVar32 * 0x800000 | uVar32 >> 0x29) ^
           (uVar32 << 0x2e | uVar32 >> 0x12) ^ (uVar32 << 0x32 | uVar32 >> 0xe));
  uVar55 = uVar37 + lVar39;
  uVar46 = (uVar48 >> 7 ^
           (uVar48 << 0x38 | uVar48 >> 8) ^ (uVar48 >> 1 | (ulong)((uVar48 & 1) != 0) << 0x3f)) +
           uVar51 + uVar53 +
           (uVar35 >> 6 ^ (uVar35 * 8 | uVar35 >> 0x3d) ^ (uVar35 << 0x2d | uVar35 >> 0x13));
  uVar44 = ((uVar37 ^ uVar45) & uVar28 ^ uVar37 & uVar45) +
           ((uVar28 * 0x2000000 | uVar28 >> 0x27) ^
           (uVar28 * 0x40000000 | uVar28 >> 0x22) ^ (uVar28 << 0x24 | uVar28 >> 0x1c)) + lVar26;
  lVar56 = uVar40 + uVar30 + ((uVar32 ^ uVar41) & uVar55 ^ uVar41) + 0x766a0abb3c77b2a8 +
           ((uVar55 * 0x800000 | uVar55 >> 0x29) ^
           (uVar55 << 0x2e | uVar55 >> 0x12) ^ (uVar55 << 0x32 | uVar55 >> 0xe));
  uVar40 = uVar28 + lVar56;
  uVar25 = (uVar27 >> 7 ^
           (uVar27 << 0x38 | uVar27 >> 8) ^ (uVar27 >> 1 | (ulong)((uVar27 & 1) != 0) << 0x3f)) +
           uVar48 + uVar38 +
           (uVar43 >> 6 ^ (uVar43 * 8 | uVar43 >> 0x3d) ^ (uVar43 << 0x2d | uVar43 >> 0x13));
  uVar36 = ((uVar28 ^ uVar37) & uVar44 ^ uVar28 & uVar37) +
           ((uVar44 * 0x2000000 | uVar44 >> 0x27) ^
           (uVar44 * 0x40000000 | uVar44 >> 0x22) ^ (uVar44 << 0x24 | uVar44 >> 0x1c)) + lVar42;
  lVar26 = uVar41 + uVar35 + ((uVar55 ^ uVar32) & uVar40 ^ uVar32) + -0x7e3d36d1b812511a +
           ((uVar40 * 0x800000 | uVar40 >> 0x29) ^
           (uVar40 << 0x2e | uVar40 >> 0x12) ^ (uVar40 << 0x32 | uVar40 >> 0xe));
  uVar41 = uVar44 + lVar26;
  uVar50 = (uVar29 >> 7 ^
           (uVar29 << 0x38 | uVar29 >> 8) ^ (uVar29 >> 1 | (ulong)((uVar29 & 1) != 0) << 0x3f)) +
           uVar27 + uVar49 +
           (uVar46 >> 6 ^ (uVar46 * 8 | uVar46 >> 0x3d) ^ (uVar46 << 0x2d | uVar46 >> 0x13));
  uVar37 = ((uVar44 ^ uVar28) & uVar36 ^ uVar44 & uVar28) +
           ((uVar36 * 0x2000000 | uVar36 >> 0x27) ^
           (uVar36 * 0x40000000 | uVar36 >> 0x22) ^ (uVar36 << 0x24 | uVar36 >> 0x1c)) + lVar39;
  lVar42 = uVar32 + uVar43 + ((uVar40 ^ uVar55) & uVar41 ^ uVar55) + -0x6d8dd37aeb7dcac5 +
           ((uVar41 * 0x800000 | uVar41 >> 0x29) ^
           (uVar41 << 0x2e | uVar41 >> 0x12) ^ (uVar41 << 0x32 | uVar41 >> 0xe));
  uVar32 = uVar36 + lVar42;
  uVar48 = (uVar52 >> 7 ^
           (uVar52 << 0x38 | uVar52 >> 8) ^ (uVar52 >> 1 | (ulong)((uVar52 & 1) != 0) << 0x3f)) +
           uVar29 + uVar33 +
           (uVar25 >> 6 ^ (uVar25 * 8 | uVar25 >> 0x3d) ^ (uVar25 << 0x2d | uVar25 >> 0x13));
  uVar29 = ((uVar36 ^ uVar44) & uVar37 ^ uVar36 & uVar44) +
           ((uVar37 * 0x2000000 | uVar37 >> 0x27) ^
           (uVar37 * 0x40000000 | uVar37 >> 0x22) ^ (uVar37 << 0x24 | uVar37 >> 0x1c)) + lVar56;
  lVar39 = uVar55 + uVar46 + ((uVar41 ^ uVar40) & uVar32 ^ uVar40) + -0x5d40175eb30efc9c +
           ((uVar32 * 0x800000 | uVar32 >> 0x29) ^
           (uVar32 << 0x2e | uVar32 >> 0x12) ^ (uVar32 << 0x32 | uVar32 >> 0xe));
  uVar55 = uVar37 + lVar39;
  uVar44 = (uVar31 >> 7 ^
           (uVar31 << 0x38 | uVar31 >> 8) ^ (uVar31 >> 1 | (ulong)((uVar31 & 1) != 0) << 0x3f)) +
           uVar52 + uVar30 +
           (uVar50 >> 6 ^ (uVar50 * 8 | uVar50 >> 0x3d) ^ (uVar50 << 0x2d | uVar50 >> 0x13));
  uVar36 = ((uVar37 ^ uVar36) & uVar29 ^ uVar37 & uVar36) +
           ((uVar29 * 0x2000000 | uVar29 >> 0x27) ^
           (uVar29 * 0x40000000 | uVar29 >> 0x22) ^ (uVar29 << 0x24 | uVar29 >> 0x1c)) + lVar26;
  lVar26 = uVar40 + uVar25 + ((uVar32 ^ uVar41) & uVar55 ^ uVar41) + -0x57e599b443bdcfff +
           ((uVar55 * 0x800000 | uVar55 >> 0x29) ^
           (uVar55 << 0x2e | uVar55 >> 0x12) ^ (uVar55 << 0x32 | uVar55 >> 0xe));
  uVar28 = uVar29 + lVar26;
  uVar27 = (uVar54 >> 7 ^
           (uVar54 << 0x38 | uVar54 >> 8) ^ (uVar54 >> 1 | (ulong)((uVar54 & 1) != 0) << 0x3f)) +
           uVar31 + uVar35 +
           (uVar48 >> 6 ^ (uVar48 * 8 | uVar48 >> 0x3d) ^ (uVar48 << 0x2d | uVar48 >> 0x13));
  uVar40 = ((uVar29 ^ uVar37) & uVar36 ^ uVar29 & uVar37) +
           ((uVar36 * 0x2000000 | uVar36 >> 0x27) ^
           (uVar36 * 0x40000000 | uVar36 >> 0x22) ^ (uVar36 << 0x24 | uVar36 >> 0x1c)) + lVar42;
  lVar56 = uVar41 + uVar50 + ((uVar55 ^ uVar32) & uVar28 ^ uVar32) + -0x3db4748f2f07686f +
           ((uVar28 * 0x800000 | uVar28 >> 0x29) ^
           (uVar28 << 0x2e | uVar28 >> 0x12) ^ (uVar28 << 0x32 | uVar28 >> 0xe));
  uVar31 = uVar36 + lVar56;
  uVar45 = ((uVar36 ^ uVar29) & uVar40 ^ uVar36 & uVar29) +
           ((uVar40 * 0x2000000 | uVar40 >> 0x27) ^
           (uVar40 * 0x40000000 | uVar40 >> 0x22) ^ (uVar40 << 0x24 | uVar40 >> 0x1c)) + lVar39;
  uVar29 = (uVar47 >> 7 ^
           (uVar47 << 0x38 | uVar47 >> 8) ^ (uVar47 >> 1 | (ulong)((uVar47 & 1) != 0) << 0x3f)) +
           uVar54 + uVar43 +
           (uVar44 >> 6 ^ (uVar44 * 8 | uVar44 >> 0x3d) ^ (uVar44 << 0x2d | uVar44 >> 0x13));
  uVar36 = ((uVar40 ^ uVar36) & uVar45 ^ uVar40 & uVar36) +
           ((uVar45 * 0x2000000 | uVar45 >> 0x27) ^
           (uVar45 * 0x40000000 | uVar45 >> 0x22) ^ (uVar45 << 0x24 | uVar45 >> 0x1c)) + lVar26;
  lVar26 = uVar32 + uVar48 + ((uVar28 ^ uVar55) & uVar31 ^ uVar55) + -0x3893ae5cf9ab41d0 +
           ((uVar31 * 0x800000 | uVar31 >> 0x29) ^
           (uVar31 << 0x2e | uVar31 >> 0x12) ^ (uVar31 << 0x32 | uVar31 >> 0xe));
  uVar32 = uVar40 + lVar26;
  uVar51 = ((uVar45 ^ uVar40) & uVar36 ^ uVar45 & uVar40) +
           ((uVar36 * 0x2000000 | uVar36 >> 0x27) ^
           (uVar36 * 0x40000000 | uVar36 >> 0x22) ^ (uVar36 << 0x24 | uVar36 >> 0x1c)) + lVar56;
  uVar47 = (uVar34 >> 7 ^
           (uVar34 << 0x38 | uVar34 >> 8) ^ (uVar34 >> 1 | (ulong)((uVar34 & 1) != 0) << 0x3f)) +
           uVar47 + uVar46 +
           (uVar27 >> 6 ^ (uVar27 * 8 | uVar27 >> 0x3d) ^ (uVar27 << 0x2d | uVar27 >> 0x13));
  uVar41 = ((uVar36 ^ uVar45) & uVar51 ^ uVar36 & uVar45) +
           ((uVar51 * 0x2000000 | uVar51 >> 0x27) ^
           (uVar51 * 0x40000000 | uVar51 >> 0x22) ^ (uVar51 << 0x24 | uVar51 >> 0x1c)) + lVar26;
  lVar26 = uVar55 + uVar44 + ((uVar31 ^ uVar28) & uVar32 ^ uVar28) + -0x2e6d17e62910ade8 +
           ((uVar32 * 0x800000 | uVar32 >> 0x29) ^
           (uVar32 << 0x2e | uVar32 >> 0x12) ^ (uVar32 << 0x32 | uVar32 >> 0xe));
  uVar45 = uVar45 + lVar26;
  uVar52 = ((uVar51 ^ uVar36) & uVar41 ^ uVar51 & uVar36) +
           ((uVar41 * 0x2000000 | uVar41 >> 0x27) ^
           (uVar41 * 0x40000000 | uVar41 >> 0x22) ^ (uVar41 << 0x24 | uVar41 >> 0x1c)) + lVar26;
  lVar26 = uVar28 + uVar27 + ((uVar32 ^ uVar31) & uVar45 ^ uVar31) + -0x2966f9dbaa9a56f0 +
           ((uVar45 * 0x800000 | uVar45 >> 0x29) ^
           (uVar45 << 0x2e | uVar45 >> 0x12) ^ (uVar45 << 0x32 | uVar45 >> 0xe));
  uVar36 = uVar36 + lVar26;
  uVar28 = ((uVar41 ^ uVar51) & uVar52 ^ uVar41 & uVar51) +
           ((uVar52 * 0x2000000 | uVar52 >> 0x27) ^
           (uVar52 * 0x40000000 | uVar52 >> 0x22) ^ (uVar52 << 0x24 | uVar52 >> 0x1c)) + lVar26;
  lVar26 = uVar31 + uVar29 + ((uVar45 ^ uVar32) & uVar36 ^ uVar32) + -0xbf1ca7aa88edfd6 +
           ((uVar36 * 0x800000 | uVar36 >> 0x29) ^
           (uVar36 << 0x2e | uVar36 >> 0x12) ^ (uVar36 << 0x32 | uVar36 >> 0xe));
  uVar51 = uVar51 + lVar26;
  uVar31 = ((uVar52 ^ uVar41) & uVar28 ^ uVar52 & uVar41) +
           ((uVar28 * 0x2000000 | uVar28 >> 0x27) ^
           (uVar28 * 0x40000000 | uVar28 >> 0x22) ^ (uVar28 << 0x24 | uVar28 >> 0x1c)) + lVar26;
  lVar26 = uVar32 + uVar47 + ((uVar36 ^ uVar45) & uVar51 ^ uVar45) + 0x106aa07032bbd1b8 +
           ((uVar51 * 0x800000 | uVar51 >> 0x29) ^
           (uVar51 << 0x2e | uVar51 >> 0x12) ^ (uVar51 << 0x32 | uVar51 >> 0xe));
  uVar41 = uVar41 + lVar26;
  uVar37 = ((uVar28 ^ uVar52) & uVar31 ^ uVar28 & uVar52) +
           ((uVar31 * 0x2000000 | uVar31 >> 0x27) ^
           (uVar31 * 0x40000000 | uVar31 >> 0x22) ^ (uVar31 << 0x24 | uVar31 >> 0x1c)) + lVar26;
  uVar32 = (uVar53 >> 7 ^
           (uVar53 << 0x38 | uVar53 >> 8) ^ (uVar53 >> 1 | (ulong)((uVar53 & 1) != 0) << 0x3f)) +
           uVar34 + uVar25 +
           (uVar29 >> 6 ^ (uVar29 * 8 | uVar29 >> 0x3d) ^ (uVar29 << 0x2d | uVar29 >> 0x13));
  uVar40 = (uVar38 >> 7 ^
           (uVar38 << 0x38 | uVar38 >> 8) ^ (uVar38 >> 1 | (ulong)((uVar38 & 1) != 0) << 0x3f)) +
           uVar53 + uVar50 +
           (uVar47 >> 6 ^ (uVar47 * 8 | uVar47 >> 0x3d) ^ (uVar47 << 0x2d | uVar47 >> 0x13));
  uVar55 = (uVar49 >> 7 ^
           (uVar49 << 0x38 | uVar49 >> 8) ^ (uVar49 >> 1 | (ulong)((uVar49 & 1) != 0) << 0x3f)) +
           uVar38 + uVar48 +
           (uVar32 >> 6 ^ (uVar32 * 8 | uVar32 >> 0x3d) ^ (uVar32 << 0x2d | uVar32 >> 0x13));
  uVar53 = (uVar33 >> 7 ^
           (uVar33 << 0x38 | uVar33 >> 8) ^ (uVar33 >> 1 | (ulong)((uVar33 & 1) != 0) << 0x3f)) +
           uVar49 + uVar44 +
           (uVar40 >> 6 ^ (uVar40 * 8 | uVar40 >> 0x3d) ^ (uVar40 << 0x2d | uVar40 >> 0x13));
  lVar39 = uVar45 + uVar32 + ((uVar51 ^ uVar36) & uVar41 ^ uVar36) + 0x19a4c116b8d2d0c8 +
           ((uVar41 * 0x800000 | uVar41 >> 0x29) ^
           (uVar41 << 0x2e | uVar41 >> 0x12) ^ (uVar41 << 0x32 | uVar41 >> 0xe));
  uVar52 = uVar52 + lVar39;
  uVar54 = (uVar30 >> 7 ^
           (uVar30 << 0x38 | uVar30 >> 8) ^ (uVar30 >> 1 | (ulong)((uVar30 & 1) != 0) << 0x3f)) +
           uVar33 + uVar27 +
           (uVar55 >> 6 ^ (uVar55 * 8 | uVar55 >> 0x3d) ^ (uVar55 << 0x2d | uVar55 >> 0x13));
  lVar26 = uVar36 + uVar40 + ((uVar41 ^ uVar51) & uVar52 ^ uVar51) + 0x1e376c085141ab53 +
           ((uVar52 * 0x800000 | uVar52 >> 0x29) ^
           (uVar52 << 0x2e | uVar52 >> 0x12) ^ (uVar52 << 0x32 | uVar52 >> 0xe));
  uVar36 = uVar28 + lVar26;
  uVar38 = (uVar35 >> 7 ^
           (uVar35 << 0x38 | uVar35 >> 8) ^ (uVar35 >> 1 | (ulong)((uVar35 & 1) != 0) << 0x3f)) +
           uVar30 + uVar29 +
           (uVar53 >> 6 ^ (uVar53 * 8 | uVar53 >> 0x3d) ^ (uVar53 << 0x2d | uVar53 >> 0x13));
  lVar42 = uVar51 + uVar55 + ((uVar52 ^ uVar41) & uVar36 ^ uVar41) + 0x2748774cdf8eeb99 +
           ((uVar36 * 0x800000 | uVar36 >> 0x29) ^
           (uVar36 << 0x2e | uVar36 >> 0x12) ^ (uVar36 << 0x32 | uVar36 >> 0xe));
  uVar45 = uVar31 + lVar42;
  uVar30 = (uVar43 >> 7 ^
           (uVar43 << 0x38 | uVar43 >> 8) ^ (uVar43 >> 1 | (ulong)((uVar43 & 1) != 0) << 0x3f)) +
           uVar35 + uVar47 +
           (uVar54 >> 6 ^ (uVar54 * 8 | uVar54 >> 0x3d) ^ (uVar54 << 0x2d | uVar54 >> 0x13));
  uVar35 = ((uVar31 ^ uVar28) & uVar37 ^ uVar31 & uVar28) +
           ((uVar37 * 0x2000000 | uVar37 >> 0x27) ^
           (uVar37 * 0x40000000 | uVar37 >> 0x22) ^ (uVar37 << 0x24 | uVar37 >> 0x1c)) + lVar39;
  lVar56 = uVar41 + uVar53 + ((uVar36 ^ uVar52) & uVar45 ^ uVar52) + 0x34b0bcb5e19b48a8 +
           ((uVar45 * 0x800000 | uVar45 >> 0x29) ^
           (uVar45 << 0x2e | uVar45 >> 0x12) ^ (uVar45 << 0x32 | uVar45 >> 0xe));
  uVar49 = uVar37 + lVar56;
  uVar57 = (uVar46 >> 7 ^
           (uVar46 << 0x38 | uVar46 >> 8) ^ (uVar46 >> 1 | (ulong)((uVar46 & 1) != 0) << 0x3f)) +
           uVar43 + uVar32 +
           (uVar38 >> 6 ^ (uVar38 * 8 | uVar38 >> 0x3d) ^ (uVar38 << 0x2d | uVar38 >> 0x13));
  uVar41 = ((uVar37 ^ uVar31) & uVar35 ^ uVar37 & uVar31) +
           ((uVar35 * 0x2000000 | uVar35 >> 0x27) ^
           (uVar35 * 0x40000000 | uVar35 >> 0x22) ^ (uVar35 << 0x24 | uVar35 >> 0x1c)) + lVar26;
  lVar39 = uVar52 + uVar54 + ((uVar45 ^ uVar36) & uVar49 ^ uVar36) + 0x391c0cb3c5c95a63 +
           ((uVar49 * 0x800000 | uVar49 >> 0x29) ^
           (uVar49 << 0x2e | uVar49 >> 0x12) ^ (uVar49 << 0x32 | uVar49 >> 0xe));
  uVar43 = uVar35 + lVar39;
  uVar33 = (uVar25 >> 7 ^
           (uVar25 << 0x38 | uVar25 >> 8) ^ (uVar25 >> 1 | (ulong)((uVar25 & 1) != 0) << 0x3f)) +
           uVar46 + uVar40 +
           (uVar30 >> 6 ^ (uVar30 * 8 | uVar30 >> 0x3d) ^ (uVar30 << 0x2d | uVar30 >> 0x13));
  uVar34 = ((uVar35 ^ uVar37) & uVar41 ^ uVar35 & uVar37) +
           ((uVar41 * 0x2000000 | uVar41 >> 0x27) ^
           (uVar41 * 0x40000000 | uVar41 >> 0x22) ^ (uVar41 << 0x24 | uVar41 >> 0x1c)) + lVar42;
  lVar26 = uVar36 + uVar38 + ((uVar49 ^ uVar45) & uVar43 ^ uVar45) + 0x4ed8aa4ae3418acb +
           ((uVar43 * 0x800000 | uVar43 >> 0x29) ^
           (uVar43 << 0x2e | uVar43 >> 0x12) ^ (uVar43 << 0x32 | uVar43 >> 0xe));
  uVar31 = uVar41 + lVar26;
  uVar51 = (uVar50 >> 7 ^
           (uVar50 << 0x38 | uVar50 >> 8) ^ (uVar50 >> 1 | (ulong)((uVar50 & 1) != 0) << 0x3f)) +
           uVar25 + uVar55 +
           (uVar57 >> 6 ^ (uVar57 * 8 | uVar57 >> 0x3d) ^ (uVar57 << 0x2d | uVar57 >> 0x13));
  uVar35 = ((uVar41 ^ uVar35) & uVar34 ^ uVar41 & uVar35) +
           ((uVar34 * 0x2000000 | uVar34 >> 0x27) ^
           (uVar34 * 0x40000000 | uVar34 >> 0x22) ^ (uVar34 << 0x24 | uVar34 >> 0x1c)) + lVar56;
  lVar56 = uVar45 + uVar30 + ((uVar43 ^ uVar49) & uVar31 ^ uVar49) + 0x5b9cca4f7763e373 +
           ((uVar31 * 0x800000 | uVar31 >> 0x29) ^
           (uVar31 << 0x2e | uVar31 >> 0x12) ^ (uVar31 << 0x32 | uVar31 >> 0xe));
  uVar28 = uVar34 + lVar56;
  uVar36 = (uVar48 >> 7 ^
           (uVar48 << 0x38 | uVar48 >> 8) ^ (uVar48 >> 1 | (ulong)((uVar48 & 1) != 0) << 0x3f)) +
           uVar50 + uVar53 +
           (uVar33 >> 6 ^ (uVar33 * 8 | uVar33 >> 0x3d) ^ (uVar33 << 0x2d | uVar33 >> 0x13));
  uVar25 = ((uVar34 ^ uVar41) & uVar35 ^ uVar34 & uVar41) +
           ((uVar35 * 0x2000000 | uVar35 >> 0x27) ^
           (uVar35 * 0x40000000 | uVar35 >> 0x22) ^ (uVar35 << 0x24 | uVar35 >> 0x1c)) + lVar39;
  lVar39 = uVar49 + uVar57 + ((uVar31 ^ uVar43) & uVar28 ^ uVar43) + 0x682e6ff3d6b2b8a3 +
           ((uVar28 * 0x800000 | uVar28 >> 0x29) ^
           (uVar28 << 0x2e | uVar28 >> 0x12) ^ (uVar28 << 0x32 | uVar28 >> 0xe));
  uVar49 = uVar35 + lVar39;
  uVar50 = (uVar44 >> 7 ^
           (uVar44 << 0x38 | uVar44 >> 8) ^ (uVar44 >> 1 | (ulong)((uVar44 & 1) != 0) << 0x3f)) +
           uVar48 + uVar54 +
           (uVar51 >> 6 ^ (uVar51 * 8 | uVar51 >> 0x3d) ^ (uVar51 << 0x2d | uVar51 >> 0x13));
  uVar41 = ((uVar35 ^ uVar34) & uVar25 ^ uVar35 & uVar34) +
           ((uVar25 * 0x2000000 | uVar25 >> 0x27) ^
           (uVar25 * 0x40000000 | uVar25 >> 0x22) ^ (uVar25 << 0x24 | uVar25 >> 0x1c)) + lVar26;
  lVar26 = uVar43 + uVar33 + ((uVar28 ^ uVar31) & uVar49 ^ uVar31) + 0x748f82ee5defb2fc +
           ((uVar49 * 0x800000 | uVar49 >> 0x29) ^
           (uVar49 << 0x2e | uVar49 >> 0x12) ^ (uVar49 << 0x32 | uVar49 >> 0xe));
  uVar43 = uVar25 + lVar26;
  uVar34 = (uVar27 >> 7 ^
           (uVar27 << 0x38 | uVar27 >> 8) ^ (uVar27 >> 1 | (ulong)((uVar27 & 1) != 0) << 0x3f)) +
           uVar44 + uVar38 +
           (uVar36 >> 6 ^ (uVar36 * 8 | uVar36 >> 0x3d) ^ (uVar36 << 0x2d | uVar36 >> 0x13));
  uVar35 = ((uVar25 ^ uVar35) & uVar41 ^ uVar25 & uVar35) +
           ((uVar41 * 0x2000000 | uVar41 >> 0x27) ^
           (uVar41 * 0x40000000 | uVar41 >> 0x22) ^ (uVar41 << 0x24 | uVar41 >> 0x1c)) + lVar56;
  lVar56 = uVar31 + uVar51 + ((uVar49 ^ uVar28) & uVar43 ^ uVar28) + 0x78a5636f43172f60 +
           ((uVar43 * 0x800000 | uVar43 >> 0x29) ^
           (uVar43 << 0x2e | uVar43 >> 0x12) ^ (uVar43 << 0x32 | uVar43 >> 0xe));
  uVar44 = uVar41 + lVar56;
  uVar45 = (uVar29 >> 7 ^
           (uVar29 << 0x38 | uVar29 >> 8) ^ (uVar29 >> 1 | (ulong)((uVar29 & 1) != 0) << 0x3f)) +
           uVar27 + uVar30 +
           (uVar50 >> 6 ^ (uVar50 * 8 | uVar50 >> 0x3d) ^ (uVar50 << 0x2d | uVar50 >> 0x13));
  uVar31 = ((uVar41 ^ uVar25) & uVar35 ^ uVar41 & uVar25) +
           ((uVar35 * 0x2000000 | uVar35 >> 0x27) ^
           (uVar35 * 0x40000000 | uVar35 >> 0x22) ^ (uVar35 << 0x24 | uVar35 >> 0x1c)) + lVar39;
  lVar39 = uVar28 + uVar36 + ((uVar43 ^ uVar49) & uVar44 ^ uVar49) + -0x7b3787eb5e0f548e +
           ((uVar44 * 0x800000 | uVar44 >> 0x29) ^
           (uVar44 << 0x2e | uVar44 >> 0x12) ^ (uVar44 << 0x32 | uVar44 >> 0xe));
  uVar27 = uVar35 + lVar39;
  uVar25 = ((uVar35 ^ uVar41) & uVar31 ^ uVar35 & uVar41) +
           ((uVar31 * 0x2000000 | uVar31 >> 0x27) ^
           (uVar31 * 0x40000000 | uVar31 >> 0x22) ^ (uVar31 << 0x24 | uVar31 >> 0x1c)) + lVar26;
  uVar41 = (uVar47 >> 7 ^
           (uVar47 << 0x38 | uVar47 >> 8) ^ (uVar47 >> 1 | (ulong)((uVar47 & 1) != 0) << 0x3f)) +
           uVar29 + uVar57 +
           (uVar34 >> 6 ^ (uVar34 * 8 | uVar34 >> 0x3d) ^ (uVar34 << 0x2d | uVar34 >> 0x13));
  uVar37 = ((uVar31 ^ uVar35) & uVar25 ^ uVar31 & uVar35) +
           ((uVar25 * 0x2000000 | uVar25 >> 0x27) ^
           (uVar25 * 0x40000000 | uVar25 >> 0x22) ^ (uVar25 << 0x24 | uVar25 >> 0x1c)) + lVar56;
  lVar26 = uVar49 + uVar50 + ((uVar44 ^ uVar43) & uVar27 ^ uVar43) + -0x7338fdf7e59bc614 +
           ((uVar27 * 0x800000 | uVar27 >> 0x29) ^
           (uVar27 << 0x2e | uVar27 >> 0x12) ^ (uVar27 << 0x32 | uVar27 >> 0xe));
  uVar46 = uVar31 + lVar26;
  uVar49 = ((uVar25 ^ uVar31) & uVar37 ^ uVar25 & uVar31) +
           ((uVar37 * 0x2000000 | uVar37 >> 0x27) ^
           (uVar37 * 0x40000000 | uVar37 >> 0x22) ^ (uVar37 << 0x24 | uVar37 >> 0x1c)) + lVar39;
  uVar31 = (uVar32 >> 7 ^
           (uVar32 << 0x38 | uVar32 >> 8) ^ (uVar32 >> 1 | (ulong)((uVar32 & 1) != 0) << 0x3f)) +
           uVar47 + uVar33 +
           (uVar45 >> 6 ^ (uVar45 * 8 | uVar45 >> 0x3d) ^ (uVar45 << 0x2d | uVar45 >> 0x13));
  uVar28 = ((uVar37 ^ uVar25) & uVar49 ^ uVar37 & uVar25) +
           ((uVar49 * 0x2000000 | uVar49 >> 0x27) ^
           (uVar49 * 0x40000000 | uVar49 >> 0x22) ^ (uVar49 << 0x24 | uVar49 >> 0x1c)) + lVar26;
  lVar26 = uVar43 + uVar34 + ((uVar27 ^ uVar44) & uVar46 ^ uVar44) + -0x6f410005dc9ce1d8 +
           ((uVar46 * 0x800000 | uVar46 >> 0x29) ^
           (uVar46 << 0x2e | uVar46 >> 0x12) ^ (uVar46 << 0x32 | uVar46 >> 0xe));
  uVar25 = uVar25 + lVar26;
  uVar29 = ((uVar49 ^ uVar37) & uVar28 ^ uVar49 & uVar37) +
           ((uVar28 * 0x2000000 | uVar28 >> 0x27) ^
           (uVar28 * 0x40000000 | uVar28 >> 0x22) ^ (uVar28 << 0x24 | uVar28 >> 0x1c)) + lVar26;
  lVar26 = uVar44 + uVar45 + ((uVar46 ^ uVar27) & uVar25 ^ uVar27) + -0x5baf9314217d4217 +
           ((uVar25 * 0x800000 | uVar25 >> 0x29) ^
           (uVar25 << 0x2e | uVar25 >> 0x12) ^ (uVar25 << 0x32 | uVar25 >> 0xe));
  uVar37 = uVar37 + lVar26;
  uVar35 = ((uVar28 ^ uVar49) & uVar29 ^ uVar28 & uVar49) +
           ((uVar29 * 0x2000000 | uVar29 >> 0x27) ^
           (uVar29 * 0x40000000 | uVar29 >> 0x22) ^ (uVar29 << 0x24 | uVar29 >> 0x1c)) + lVar26;
  lVar26 = uVar27 + uVar41 + ((uVar25 ^ uVar46) & uVar37 ^ uVar46) + -0x41065c084d3986eb +
           ((uVar37 * 0x800000 | uVar37 >> 0x29) ^
           (uVar37 << 0x2e | uVar37 >> 0x12) ^ (uVar37 << 0x32 | uVar37 >> 0xe));
  uVar49 = uVar49 + lVar26;
  uVar43 = ((uVar29 ^ uVar28) & uVar35 ^ uVar29 & uVar28) +
           ((uVar35 * 0x2000000 | uVar35 >> 0x27) ^
           (uVar35 * 0x40000000 | uVar35 >> 0x22) ^ (uVar35 << 0x24 | uVar35 >> 0x1c)) + lVar26;
  lVar26 = uVar46 + uVar31 + ((uVar37 ^ uVar25) & uVar49 ^ uVar25) + -0x398e870d1c8dacd5 +
           ((uVar49 * 0x800000 | uVar49 >> 0x29) ^
           (uVar49 << 0x2e | uVar49 >> 0x12) ^ (uVar49 << 0x32 | uVar49 >> 0xe));
  uVar28 = uVar28 + lVar26;
  uVar27 = ((uVar35 ^ uVar29) & uVar43 ^ uVar35 & uVar29) +
           ((uVar43 * 0x2000000 | uVar43 >> 0x27) ^
           (uVar43 * 0x40000000 | uVar43 >> 0x22) ^ (uVar43 << 0x24 | uVar43 >> 0x1c)) + lVar26;
  uVar44 = (uVar40 >> 7 ^
           (uVar40 << 0x38 | uVar40 >> 8) ^ (uVar40 >> 1 | (ulong)((uVar40 & 1) != 0) << 0x3f)) +
           uVar32 + uVar51 +
           (uVar41 >> 6 ^ (uVar41 * 8 | uVar41 >> 0x3d) ^ (uVar41 << 0x2d | uVar41 >> 0x13));
  uVar40 = (uVar55 >> 7 ^
           (uVar55 << 0x38 | uVar55 >> 8) ^ (uVar55 >> 1 | (ulong)((uVar55 & 1) != 0) << 0x3f)) +
           uVar40 + uVar36 +
           (uVar31 >> 6 ^ (uVar31 * 8 | uVar31 >> 0x3d) ^ (uVar31 << 0x2d | uVar31 >> 0x13));
  uVar46 = (uVar53 >> 7 ^
           (uVar53 << 0x38 | uVar53 >> 8) ^ (uVar53 >> 1 | (ulong)((uVar53 & 1) != 0) << 0x3f)) +
           uVar55 + uVar50 +
           (uVar44 >> 6 ^ (uVar44 * 8 | uVar44 >> 0x3d) ^ (uVar44 << 0x2d | uVar44 >> 0x13));
  uVar32 = (uVar54 >> 7 ^
           (uVar54 << 0x38 | uVar54 >> 8) ^ (uVar54 >> 1 | (ulong)((uVar54 & 1) != 0) << 0x3f)) +
           uVar53 + uVar34 +
           (uVar40 >> 6 ^ (uVar40 * 8 | uVar40 >> 0x3d) ^ (uVar40 << 0x2d | uVar40 >> 0x13));
  uVar48 = (uVar38 >> 7 ^
           (uVar38 << 0x38 | uVar38 >> 8) ^ (uVar38 >> 1 | (ulong)((uVar38 & 1) != 0) << 0x3f)) +
           uVar54 + uVar45 +
           (uVar46 >> 6 ^ (uVar46 * 8 | uVar46 >> 0x3d) ^ (uVar46 << 0x2d | uVar46 >> 0x13));
  uVar54 = (uVar30 >> 7 ^
           (uVar30 << 0x38 | uVar30 >> 8) ^ (uVar30 >> 1 | (ulong)((uVar30 & 1) != 0) << 0x3f)) +
           uVar38 + uVar41 +
           (uVar32 >> 6 ^ (uVar32 * 8 | uVar32 >> 0x3d) ^ (uVar32 << 0x2d | uVar32 >> 0x13));
  lVar26 = uVar44 + uVar25 + ((uVar49 ^ uVar37) & uVar28 ^ uVar37) + -0x35d8c13115d99e64 +
           ((uVar28 * 0x800000 | uVar28 >> 0x29) ^
           (uVar28 << 0x2e | uVar28 >> 0x12) ^ (uVar28 << 0x32 | uVar28 >> 0xe));
  uVar29 = uVar29 + lVar26;
  lVar56 = uVar40 + uVar37 + ((uVar28 ^ uVar49) & uVar29 ^ uVar49) + -0x2e794738de3f3df9 +
           ((uVar29 * 0x800000 | uVar29 >> 0x29) ^
           (uVar29 << 0x2e | uVar29 >> 0x12) ^ (uVar29 << 0x32 | uVar29 >> 0xe));
  uVar25 = uVar35 + lVar56;
  lVar39 = uVar46 + uVar49 + ((uVar29 ^ uVar28) & uVar25 ^ uVar28) + -0x15258229321f14e2 +
           ((uVar25 * 0x800000 | uVar25 >> 0x29) ^
           (uVar25 << 0x2e | uVar25 >> 0x12) ^ (uVar25 << 0x32 | uVar25 >> 0xe));
  uVar47 = uVar43 + lVar39;
  uVar30 = (uVar57 >> 7 ^
           (uVar57 << 0x38 | uVar57 >> 8) ^ (uVar57 >> 1 | (ulong)((uVar57 & 1) != 0) << 0x3f)) +
           uVar30 + uVar31 +
           (uVar48 >> 6 ^ (uVar48 * 8 | uVar48 >> 0x3d) ^ (uVar48 << 0x2d | uVar48 >> 0x13));
  uVar55 = ((uVar43 ^ uVar35) & uVar27 ^ uVar43 & uVar35) +
           ((uVar27 * 0x2000000 | uVar27 >> 0x27) ^
           (uVar27 * 0x40000000 | uVar27 >> 0x22) ^ (uVar27 << 0x24 | uVar27 >> 0x1c)) + lVar26;
  lVar42 = uVar32 + uVar28 + ((uVar25 ^ uVar29) & uVar47 ^ uVar29) + -0xa82b08011912e88 +
           ((uVar47 * 0x800000 | uVar47 >> 0x29) ^
           (uVar47 << 0x2e | uVar47 >> 0x12) ^ (uVar47 << 0x32 | uVar47 >> 0xe));
  uVar49 = uVar27 + lVar42;
  uVar38 = (uVar33 >> 7 ^
           (uVar33 << 0x38 | uVar33 >> 8) ^ (uVar33 >> 1 | (ulong)((uVar33 & 1) != 0) << 0x3f)) +
           uVar57 + uVar44 +
           (uVar54 >> 6 ^ (uVar54 * 8 | uVar54 >> 0x3d) ^ (uVar54 << 0x2d | uVar54 >> 0x13));
  uVar35 = ((uVar27 ^ uVar43) & uVar55 ^ uVar27 & uVar43) +
           ((uVar55 * 0x2000000 | uVar55 >> 0x27) ^
           (uVar55 * 0x40000000 | uVar55 >> 0x22) ^ (uVar55 << 0x24 | uVar55 >> 0x1c)) + lVar56;
  lVar26 = uVar29 + uVar48 + ((uVar47 ^ uVar25) & uVar49 ^ uVar25) + 0x6f067aa72176fba +
           ((uVar49 * 0x800000 | uVar49 >> 0x29) ^
           (uVar49 << 0x2e | uVar49 >> 0x12) ^ (uVar49 << 0x32 | uVar49 >> 0xe));
  uVar53 = uVar55 + lVar26;
  uVar29 = (uVar51 >> 7 ^
           (uVar51 << 0x38 | uVar51 >> 8) ^ (uVar51 >> 1 | (ulong)((uVar51 & 1) != 0) << 0x3f)) +
           uVar33 + uVar40 +
           (uVar30 >> 6 ^ (uVar30 * 8 | uVar30 >> 0x3d) ^ (uVar30 << 0x2d | uVar30 >> 0x13));
  uVar33 = ((uVar55 ^ uVar27) & uVar35 ^ uVar55 & uVar27) +
           ((uVar35 * 0x2000000 | uVar35 >> 0x27) ^
           (uVar35 * 0x40000000 | uVar35 >> 0x22) ^ (uVar35 << 0x24 | uVar35 >> 0x1c)) + lVar39;
  lVar39 = uVar25 + uVar54 + ((uVar49 ^ uVar47) & uVar53 ^ uVar47) + 0xa637dc5a2c898a6 +
           ((uVar53 * 0x800000 | uVar53 >> 0x29) ^
           (uVar53 << 0x2e | uVar53 >> 0x12) ^ (uVar53 << 0x32 | uVar53 >> 0xe));
  uVar37 = uVar35 + lVar39;
  uVar25 = (uVar36 >> 7 ^
           (uVar36 << 0x38 | uVar36 >> 8) ^ (uVar36 >> 1 | (ulong)((uVar36 & 1) != 0) << 0x3f)) +
           uVar51 + uVar46 +
           (uVar38 >> 6 ^ (uVar38 * 8 | uVar38 >> 0x3d) ^ (uVar38 << 0x2d | uVar38 >> 0x13));
  uVar40 = ((uVar35 ^ uVar55) & uVar33 ^ uVar35 & uVar55) +
           ((uVar33 * 0x2000000 | uVar33 >> 0x27) ^
           (uVar33 * 0x40000000 | uVar33 >> 0x22) ^ (uVar33 << 0x24 | uVar33 >> 0x1c)) + lVar42;
  lVar56 = uVar47 + uVar30 + ((uVar53 ^ uVar49) & uVar37 ^ uVar49) + 0x113f9804bef90dae +
           ((uVar37 * 0x800000 | uVar37 >> 0x29) ^
           (uVar37 << 0x2e | uVar37 >> 0x12) ^ (uVar37 << 0x32 | uVar37 >> 0xe));
  uVar28 = uVar33 + lVar56;
  uVar27 = (uVar50 >> 7 ^
           (uVar50 << 0x38 | uVar50 >> 8) ^ (uVar50 >> 1 | (ulong)((uVar50 & 1) != 0) << 0x3f)) +
           uVar36 + uVar32 +
           (uVar29 >> 6 ^ (uVar29 * 8 | uVar29 >> 0x3d) ^ (uVar29 << 0x2d | uVar29 >> 0x13));
  uVar43 = ((uVar33 ^ uVar35) & uVar40 ^ uVar33 & uVar35) +
           ((uVar40 * 0x2000000 | uVar40 >> 0x27) ^
           (uVar40 * 0x40000000 | uVar40 >> 0x22) ^ (uVar40 << 0x24 | uVar40 >> 0x1c)) + lVar26;
  lVar26 = uVar49 + uVar38 + ((uVar37 ^ uVar53) & uVar28 ^ uVar53) + 0x1b710b35131c471b +
           ((uVar28 * 0x800000 | uVar28 >> 0x29) ^
           (uVar28 << 0x2e | uVar28 >> 0x12) ^ (uVar28 << 0x32 | uVar28 >> 0xe));
  uVar35 = uVar40 + lVar26;
  uVar55 = (uVar34 >> 7 ^
           (uVar34 << 0x38 | uVar34 >> 8) ^ (uVar34 >> 1 | (ulong)((uVar34 & 1) != 0) << 0x3f)) +
           uVar50 + uVar48 +
           (uVar25 >> 6 ^ (uVar25 * 8 | uVar25 >> 0x3d) ^ (uVar25 << 0x2d | uVar25 >> 0x13));
  uVar36 = ((uVar40 ^ uVar33) & uVar43 ^ uVar40 & uVar33) +
           ((uVar43 * 0x2000000 | uVar43 >> 0x27) ^
           (uVar43 * 0x40000000 | uVar43 >> 0x22) ^ (uVar43 << 0x24 | uVar43 >> 0x1c)) + lVar39;
  lVar42 = uVar53 + uVar29 + ((uVar28 ^ uVar37) & uVar35 ^ uVar37) + 0x28db77f523047d84 +
           ((uVar35 * 0x800000 | uVar35 >> 0x29) ^
           (uVar35 << 0x2e | uVar35 >> 0x12) ^ (uVar35 << 0x32 | uVar35 >> 0xe));
  uVar32 = uVar43 + lVar42;
  uVar33 = (uVar45 >> 7 ^
           (uVar45 << 0x38 | uVar45 >> 8) ^ (uVar45 >> 1 | (ulong)((uVar45 & 1) != 0) << 0x3f)) +
           uVar34 + uVar54 +
           (uVar27 >> 6 ^ (uVar27 * 8 | uVar27 >> 0x3d) ^ (uVar27 << 0x2d | uVar27 >> 0x13));
  uVar40 = ((uVar43 ^ uVar40) & uVar36 ^ uVar43 & uVar40) +
           ((uVar36 * 0x2000000 | uVar36 >> 0x27) ^
           (uVar36 * 0x40000000 | uVar36 >> 0x22) ^ (uVar36 << 0x24 | uVar36 >> 0x1c)) + lVar56;
  lVar39 = uVar37 + uVar25 + ((uVar35 ^ uVar28) & uVar32 ^ uVar28) + 0x32caab7b40c72493 +
           ((uVar32 * 0x800000 | uVar32 >> 0x29) ^
           (uVar32 << 0x2e | uVar32 >> 0x12) ^ (uVar32 << 0x32 | uVar32 >> 0xe));
  uVar54 = uVar36 + lVar39;
  uVar25 = (uVar41 >> 7 ^
           (uVar41 << 0x38 | uVar41 >> 8) ^ (uVar41 >> 1 | (ulong)((uVar41 & 1) != 0) << 0x3f)) +
           uVar45 + uVar30 +
           (uVar55 >> 6 ^ (uVar55 * 8 | uVar55 >> 0x3d) ^ (uVar55 << 0x2d | uVar55 >> 0x13));
  uVar34 = ((uVar36 ^ uVar43) & uVar40 ^ uVar36 & uVar43) +
           ((uVar40 * 0x2000000 | uVar40 >> 0x27) ^
           (uVar40 * 0x40000000 | uVar40 >> 0x22) ^ (uVar40 << 0x24 | uVar40 >> 0x1c)) + lVar26;
  uVar30 = ((uVar40 ^ uVar36) & uVar34 ^ uVar40 & uVar36) +
           ((uVar34 * 0x2000000 | uVar34 >> 0x27) ^
           (uVar34 * 0x40000000 | uVar34 >> 0x22) ^ (uVar34 << 0x24 | uVar34 >> 0x1c)) + lVar42;
  lVar26 = uVar28 + uVar27 + ((uVar32 ^ uVar35) & uVar54 ^ uVar35) + 0x3c9ebe0a15c9bebc +
           ((uVar54 * 0x800000 | uVar54 >> 0x29) ^
           (uVar54 << 0x2e | uVar54 >> 0x12) ^ (uVar54 << 0x32 | uVar54 >> 0xe));
  uVar43 = uVar40 + lVar26;
  uVar40 = ((uVar34 ^ uVar40) & uVar30 ^ uVar34 & uVar40) +
           ((uVar30 * 0x2000000 | uVar30 >> 0x27) ^
           (uVar30 * 0x40000000 | uVar30 >> 0x22) ^ (uVar30 << 0x24 | uVar30 >> 0x1c)) + lVar39;
  lVar39 = uVar35 + uVar55 + ((uVar54 ^ uVar32) & uVar43 ^ uVar32) + 0x431d67c49c100d4c +
           ((uVar43 * 0x800000 | uVar43 >> 0x29) ^
           (uVar43 << 0x2e | uVar43 >> 0x12) ^ (uVar43 << 0x32 | uVar43 >> 0xe));
  uVar28 = uVar34 + lVar39;
  uVar35 = ((uVar30 ^ uVar34) & uVar40 ^ uVar30 & uVar34) +
           ((uVar40 * 0x2000000 | uVar40 >> 0x27) ^
           (uVar40 * 0x40000000 | uVar40 >> 0x22) ^ (uVar40 << 0x24 | uVar40 >> 0x1c)) + lVar26;
  uVar34 = ((uVar40 ^ uVar30) & uVar35 ^ uVar40 & uVar30) +
           ((uVar35 * 0x2000000 | uVar35 >> 0x27) ^
           (uVar35 * 0x40000000 | uVar35 >> 0x22) ^ (uVar35 << 0x24 | uVar35 >> 0x1c)) + lVar39;
  lVar26 = uVar32 + uVar33 + ((uVar43 ^ uVar54) & uVar28 ^ uVar54) + 0x4cc5d4becb3e42b6 +
           ((uVar28 * 0x800000 | uVar28 >> 0x29) ^
           (uVar28 << 0x2e | uVar28 >> 0x12) ^ (uVar28 << 0x32 | uVar28 >> 0xe));
  uVar30 = uVar30 + lVar26;
  uVar27 = ((uVar35 ^ uVar40) & uVar34 ^ uVar35 & uVar40) +
           ((uVar34 * 0x2000000 | uVar34 >> 0x27) ^
           (uVar34 * 0x40000000 | uVar34 >> 0x22) ^ (uVar34 << 0x24 | uVar34 >> 0x1c)) + lVar26;
  lVar26 = uVar54 + uVar25 + ((uVar28 ^ uVar43) & uVar30 ^ uVar43) + 0x597f299cfc657e2a +
           ((uVar30 * 0x800000 | uVar30 >> 0x29) ^
           (uVar30 << 0x2e | uVar30 >> 0x12) ^ (uVar30 << 0x32 | uVar30 >> 0xe));
  uVar40 = uVar40 + lVar26;
  uVar32 = ((uVar34 ^ uVar35) & uVar27 ^ uVar34 & uVar35) +
           ((uVar27 * 0x2000000 | uVar27 >> 0x27) ^
           (uVar27 * 0x40000000 | uVar27 >> 0x22) ^ (uVar27 << 0x24 | uVar27 >> 0x1c)) + lVar26;
  lVar26 = (uVar31 >> 7 ^
           (uVar31 << 0x38 | uVar31 >> 8) ^ (uVar31 >> 1 | (ulong)((uVar31 & 1) != 0) << 0x3f)) +
           uVar41 + uVar38 +
           (uVar33 >> 6 ^ (uVar33 * 8 | uVar33 >> 0x3d) ^ (uVar33 << 0x2d | uVar33 >> 0x13)) +
           uVar43 + ((uVar30 ^ uVar28) & uVar40 ^ uVar28) + 0x5fcb6fab3ad6faec +
           ((uVar40 * 0x800000 | uVar40 >> 0x29) ^
           (uVar40 << 0x2e | uVar40 >> 0x12) ^ (uVar40 << 0x32 | uVar40 >> 0xe));
  uVar35 = uVar35 + lVar26;
  uVar33 = ((uVar27 ^ uVar34) & uVar32 ^ uVar27 & uVar34) +
           ((uVar32 * 0x2000000 | uVar32 >> 0x27) ^
           (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ (uVar32 << 0x24 | uVar32 >> 0x1c)) + lVar26;
  lVar26 = (uVar44 >> 7 ^
           (uVar44 << 0x38 | uVar44 >> 8) ^ (uVar44 >> 1 | (ulong)((uVar44 & 1) != 0) << 0x3f)) +
           uVar31 + uVar29 +
           (uVar25 >> 6 ^ (uVar25 * 8 | uVar25 >> 0x3d) ^ (uVar25 << 0x2d | uVar25 >> 0x13)) +
           uVar28 + ((uVar40 ^ uVar30) & uVar35 ^ uVar30) + 0x6c44198c4a475817 +
           ((uVar35 * 0x800000 | uVar35 >> 0x29) ^
           (uVar35 << 0x2e | uVar35 >> 0x12) ^ (uVar35 << 0x32 | uVar35 >> 0xe));
  ctx->state[0] =
       ((uVar32 ^ uVar27) & uVar33 ^ uVar32 & uVar27) + uVar1 +
       ((uVar33 * 0x2000000 | uVar33 >> 0x27) ^
       (uVar33 * 0x40000000 | uVar33 >> 0x22) ^ (uVar33 << 0x24 | uVar33 >> 0x1c)) + lVar26;
  ctx->state[1] = uVar33 + uVar2;
  ctx->state[2] = uVar32 + uVar3;
  ctx->state[3] = uVar27 + uVar4;
  ctx->state[4] = uVar34 + uVar5 + lVar26;
  ctx->state[5] = uVar35 + uVar6;
  ctx->state[6] = uVar40 + uVar7;
  ctx->state[7] = uVar30 + uVar8;
  return;
}

Assistant:

static DECAF_NOINLINE void hashblock(decaf_sha512_ctx_t ctx) {
    const uint8_t *in = ctx->block;
    uint64_t a = ctx->state[0];
    uint64_t b = ctx->state[1];
    uint64_t c = ctx->state[2];
    uint64_t d = ctx->state[3];
    uint64_t e = ctx->state[4];
    uint64_t f = ctx->state[5];
    uint64_t g = ctx->state[6];
    uint64_t h = ctx->state[7];
    uint64_t T1;
    uint64_t T2;
    
    uint64_t w0  = load_bigendian(in +   0);
    uint64_t w1  = load_bigendian(in +   8);
    uint64_t w2  = load_bigendian(in +  16);
    uint64_t w3  = load_bigendian(in +  24);
    uint64_t w4  = load_bigendian(in +  32);
    uint64_t w5  = load_bigendian(in +  40);
    uint64_t w6  = load_bigendian(in +  48);
    uint64_t w7  = load_bigendian(in +  56);
    uint64_t w8  = load_bigendian(in +  64);
    uint64_t w9  = load_bigendian(in +  72);
    uint64_t w10 = load_bigendian(in +  80);
    uint64_t w11 = load_bigendian(in +  88);
    uint64_t w12 = load_bigendian(in +  96);
    uint64_t w13 = load_bigendian(in + 104);
    uint64_t w14 = load_bigendian(in + 112);
    uint64_t w15 = load_bigendian(in + 120);

    F(w0 ,0x428a2f98d728ae22ULL)
    F(w1 ,0x7137449123ef65cdULL)
    F(w2 ,0xb5c0fbcfec4d3b2fULL)
    F(w3 ,0xe9b5dba58189dbbcULL)
    F(w4 ,0x3956c25bf348b538ULL)
    F(w5 ,0x59f111f1b605d019ULL)
    F(w6 ,0x923f82a4af194f9bULL)
    F(w7 ,0xab1c5ed5da6d8118ULL)
    F(w8 ,0xd807aa98a3030242ULL)
    F(w9 ,0x12835b0145706fbeULL)
    F(w10,0x243185be4ee4b28cULL)
    F(w11,0x550c7dc3d5ffb4e2ULL)
    F(w12,0x72be5d74f27b896fULL)
    F(w13,0x80deb1fe3b1696b1ULL)
    F(w14,0x9bdc06a725c71235ULL)
    F(w15,0xc19bf174cf692694ULL)

    EXPAND

    F(w0 ,0xe49b69c19ef14ad2ULL)
    F(w1 ,0xefbe4786384f25e3ULL)
    F(w2 ,0x0fc19dc68b8cd5b5ULL)
    F(w3 ,0x240ca1cc77ac9c65ULL)
    F(w4 ,0x2de92c6f592b0275ULL)
    F(w5 ,0x4a7484aa6ea6e483ULL)
    F(w6 ,0x5cb0a9dcbd41fbd4ULL)
    F(w7 ,0x76f988da831153b5ULL)
    F(w8 ,0x983e5152ee66dfabULL)
    F(w9 ,0xa831c66d2db43210ULL)
    F(w10,0xb00327c898fb213fULL)
    F(w11,0xbf597fc7beef0ee4ULL)
    F(w12,0xc6e00bf33da88fc2ULL)
    F(w13,0xd5a79147930aa725ULL)
    F(w14,0x06ca6351e003826fULL)
    F(w15,0x142929670a0e6e70ULL)

    EXPAND

    F(w0 ,0x27b70a8546d22ffcULL)
    F(w1 ,0x2e1b21385c26c926ULL)
    F(w2 ,0x4d2c6dfc5ac42aedULL)
    F(w3 ,0x53380d139d95b3dfULL)
    F(w4 ,0x650a73548baf63deULL)
    F(w5 ,0x766a0abb3c77b2a8ULL)
    F(w6 ,0x81c2c92e47edaee6ULL)
    F(w7 ,0x92722c851482353bULL)
    F(w8 ,0xa2bfe8a14cf10364ULL)
    F(w9 ,0xa81a664bbc423001ULL)
    F(w10,0xc24b8b70d0f89791ULL)
    F(w11,0xc76c51a30654be30ULL)
    F(w12,0xd192e819d6ef5218ULL)
    F(w13,0xd69906245565a910ULL)
    F(w14,0xf40e35855771202aULL)
    F(w15,0x106aa07032bbd1b8ULL)

    EXPAND

    F(w0 ,0x19a4c116b8d2d0c8ULL)
    F(w1 ,0x1e376c085141ab53ULL)
    F(w2 ,0x2748774cdf8eeb99ULL)
    F(w3 ,0x34b0bcb5e19b48a8ULL)
    F(w4 ,0x391c0cb3c5c95a63ULL)
    F(w5 ,0x4ed8aa4ae3418acbULL)
    F(w6 ,0x5b9cca4f7763e373ULL)
    F(w7 ,0x682e6ff3d6b2b8a3ULL)
    F(w8 ,0x748f82ee5defb2fcULL)
    F(w9 ,0x78a5636f43172f60ULL)
    F(w10,0x84c87814a1f0ab72ULL)
    F(w11,0x8cc702081a6439ecULL)
    F(w12,0x90befffa23631e28ULL)
    F(w13,0xa4506cebde82bde9ULL)
    F(w14,0xbef9a3f7b2c67915ULL)
    F(w15,0xc67178f2e372532bULL)

    EXPAND

    F(w0 ,0xca273eceea26619cULL)
    F(w1 ,0xd186b8c721c0c207ULL)
    F(w2 ,0xeada7dd6cde0eb1eULL)
    F(w3 ,0xf57d4f7fee6ed178ULL)
    F(w4 ,0x06f067aa72176fbaULL)
    F(w5 ,0x0a637dc5a2c898a6ULL)
    F(w6 ,0x113f9804bef90daeULL)
    F(w7 ,0x1b710b35131c471bULL)
    F(w8 ,0x28db77f523047d84ULL)
    F(w9 ,0x32caab7b40c72493ULL)
    F(w10,0x3c9ebe0a15c9bebcULL)
    F(w11,0x431d67c49c100d4cULL)
    F(w12,0x4cc5d4becb3e42b6ULL)
    F(w13,0x597f299cfc657e2aULL)
    F(w14,0x5fcb6fab3ad6faecULL)
    F(w15,0x6c44198c4a475817ULL)
  
    ctx->state[0] += a;
    ctx->state[1] += b;
    ctx->state[2] += c;
    ctx->state[3] += d;
    ctx->state[4] += e;
    ctx->state[5] += f;
    ctx->state[6] += g;
    ctx->state[7] += h;
}